

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

void check_sockname(sockaddr *addr,char *compare_ip,int compare_port,char *context)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  int64_t eval_b;
  char check_ip [17];
  sockaddr_in check_addr;
  int64_t eval_b_4;
  sockaddr_in compare_addr;
  ulong local_58 [4];
  sockaddr_in local_38;
  undefined8 local_28;
  sockaddr_in local_20;
  
  local_38.sin_family = addr->sa_family;
  local_38.sin_port._0_1_ = addr->sa_data[0];
  local_38.sin_port._1_1_ = addr->sa_data[1];
  local_38.sin_addr.s_addr._0_1_ = addr->sa_data[2];
  local_38.sin_addr.s_addr._1_1_ = addr->sa_data[3];
  local_38.sin_addr.s_addr._2_1_ = addr->sa_data[4];
  local_38.sin_addr.s_addr._3_1_ = addr->sa_data[5];
  local_38.sin_zero = *(uchar (*) [8])(addr->sa_data + 6);
  __size = (undefined8 *)(ulong)(uint)compare_port;
  iVar1 = uv_ip4_addr(compare_ip,compare_port,&local_20);
  local_58[0] = (ulong)iVar1;
  if (local_58[0] == 0) {
    local_58[0] = local_38._0_8_ & 0xffff;
    if (local_58[0] != 2) goto LAB_0019ab95;
    local_58[0] = (ulong)local_20.sin_family;
    if (local_58[0] != 2) goto LAB_0019aba4;
    uVar2 = local_38.sin_addr.s_addr >> 0x18 | (local_38.sin_addr.s_addr & 0xff0000) >> 8 |
            (local_38.sin_addr.s_addr & 0xff00) << 8 | local_38.sin_addr.s_addr << 0x18;
    uVar4 = local_20.sin_addr.s_addr >> 0x18 | (local_20.sin_addr.s_addr & 0xff0000) >> 8 |
            (local_20.sin_addr.s_addr & 0xff00) << 8 | local_20.sin_addr.s_addr << 0x18;
    local_58[0] = (ulong)(int)((uint)(uVar2 >= uVar4 && uVar2 != uVar4) - (uint)(uVar2 < uVar4));
    if (local_58[0] != 0) goto LAB_0019abb3;
    if ((compare_port != 0) && (local_38.sin_port != local_20.sin_port)) goto LAB_0019abd1;
    iVar1 = uv_ip4_name(&local_38,(char *)local_58,0x11);
    local_28 = 0;
    if (iVar1 == 0) {
      printf("%s: %s:%d\n",context,local_58,
             (ulong)(ushort)(local_38.sin_port << 8 | local_38.sin_port >> 8));
      return;
    }
  }
  else {
    check_sockname_cold_1();
LAB_0019ab95:
    check_sockname_cold_2();
LAB_0019aba4:
    check_sockname_cold_3();
LAB_0019abb3:
    check_sockname_cold_4();
  }
  __size = &local_28;
  check_sockname_cold_6();
LAB_0019abd1:
  check_sockname_cold_5();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void check_sockname(struct sockaddr* addr, const char* compare_ip,
  int compare_port, const char* context) {
  struct sockaddr_in check_addr = *(struct sockaddr_in*) addr;
  struct sockaddr_in compare_addr;
  char check_ip[17];
  int r;

  ASSERT_OK(uv_ip4_addr(compare_ip, compare_port, &compare_addr));

  /* Both addresses should be ipv4 */
  ASSERT_EQ(check_addr.sin_family, AF_INET);
  ASSERT_EQ(compare_addr.sin_family, AF_INET);

  /* Check if the ip matches */
  ASSERT_OK(memcmp(&check_addr.sin_addr,
            &compare_addr.sin_addr,
            sizeof compare_addr.sin_addr));

  /* Check if the port matches. If port == 0 anything goes. */
  ASSERT(compare_port == 0 || check_addr.sin_port == compare_addr.sin_port);

  r = uv_ip4_name(&check_addr, (char*) check_ip, sizeof check_ip);
  ASSERT_OK(r);

  printf("%s: %s:%d\n", context, check_ip, ntohs(check_addr.sin_port));
}